

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

bool __thiscall
math::wide_integer::uintwide_t<64u,unsigned_char,void,true>::wr_string<char*>
          (uintwide_t<64u,unsigned_char,void,true> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  value_type_conflict4 *pvVar1;
  byte bVar2;
  value_type_conflict4 avVar3 [8];
  value_type_conflict4 avVar4 [8];
  value_type_conflict4 avVar5 [8];
  unsigned_fast_type i_1;
  long lVar6;
  uintwide_t<64U,_unsigned_char,_void,_true> uVar7;
  unsigned_fast_type uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ushort uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  undefined7 in_register_00000011;
  byte bVar16;
  bool bVar17;
  uintwide_t<64U,_unsigned_char,_void,_false> t;
  array<unsigned_char,_8UL> local_68;
  value_type_conflict4 local_60 [8];
  byte abStack_58 [23];
  uint uStack_41;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  value_type_conflict4 local_38 [8];
  
  iVar13 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar13 != 0x10) {
    if (iVar13 == 10) {
      avVar3 = *(value_type_conflict4 (*) [8])this;
      local_60[0] = avVar3[0];
      local_60[1] = avVar3[1];
      local_60[2] = avVar3[2];
      local_60[3] = avVar3[3];
      local_60[4] = avVar3[4];
      local_60[5] = avVar3[5];
      local_60[6] = avVar3[6];
      local_60[7] = avVar3[7];
      if ((long)avVar3 < 0) {
        lVar6 = 0;
        do {
          local_60[lVar6] = ~local_60[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 8);
        lVar6 = 0;
        do {
          pvVar1 = local_60 + lVar6;
          *pvVar1 = *pvVar1 + '\x01';
          if (*pvVar1 != '\0') break;
          bVar17 = lVar6 != 7;
          lVar6 = lVar6 + 1;
        } while (bVar17);
      }
      abStack_58[0x10] = 0;
      abStack_58[0x11] = 0;
      abStack_58[0x12] = 0;
      abStack_58[0x13] = 0;
      abStack_58[0x14] = 0;
      abStack_58[0x15] = 0;
      abStack_58[0x16] = 0;
      uStack_41 = 0;
      uStack_3d = 0;
      uStack_3c = 0;
      abStack_58[0] = 0;
      abStack_58[1] = 0;
      abStack_58[2] = 0;
      abStack_58[3] = 0;
      abStack_58[4] = 0;
      abStack_58[5] = 0;
      abStack_58[6] = 0;
      abStack_58[7] = 0;
      abStack_58[8] = 0;
      abStack_58[9] = 0;
      abStack_58[10] = 0;
      abStack_58[0xb] = 0;
      abStack_58[0xc] = 0;
      abStack_58[0xd] = 0;
      abStack_58[0xe] = 0;
      abStack_58[0xf] = 0;
      if (local_60[0] == '\0') {
        lVar6 = 1;
        do {
          lVar11 = lVar6;
          if (lVar11 == 8) goto LAB_0013de77;
          lVar6 = lVar11 + 1;
        } while (local_60[lVar11] == '\0');
        if (lVar11 == 8) {
LAB_0013de77:
          uStack_3d = 0x30;
          uVar9 = 0x1b;
LAB_0013de81:
          if ((0 < (long)uVar9) && ((long)avVar3 < 0 || show_pos)) {
            bVar16 = 0x2d;
            if (-1 < (long)avVar3) {
              bVar16 = !show_pos * '\x02' + 0x2b;
            }
            uVar9 = uVar9 - 1;
            abStack_58[uVar9 & 0xffffffff] = bVar16;
          }
          if (field_width != 0) {
            lVar6 = 0;
            if (field_width < 0x1d) {
              lVar6 = 0x1c - field_width;
            }
            while (lVar6 < (long)uVar9) {
              uVar9 = uVar9 - 1;
              abStack_58[uVar9 & 0xffffffff] = fill_char_str;
            }
          }
          uStack_3c = 0;
          lVar6 = 0;
          do {
            bVar16 = abStack_58[lVar6 + uVar9];
            str_result[lVar6] = bVar16;
            lVar6 = lVar6 + 1;
          } while (bVar16 != 0);
          return true;
        }
      }
      uVar9 = 0x1c;
      do {
        avVar4 = local_60;
        if (local_60[0] == '\0') {
          lVar6 = 1;
          do {
            bVar17 = lVar6 == 8;
            if (bVar17) break;
            pvVar1 = local_60 + lVar6;
            lVar6 = lVar6 + 1;
          } while (*pvVar1 == '\0');
        }
        else {
          bVar17 = false;
        }
        if ((uVar9 == 0) || (bVar17)) goto LAB_0013de81;
        lVar6 = 7;
        uVar14 = 0;
        uVar15 = 0;
        do {
          uVar14 = (uVar15 + uVar14 * 0xf6) * 0x100;
          uVar15 = uVar14 | local_60[lVar6];
          uVar14 = (uVar14 & 0xffff | (uint)local_60[lVar6]) / 10;
          local_60[lVar6] = (value_type_conflict4)uVar14;
          avVar5 = local_60;
          bVar17 = lVar6 != 0;
          lVar6 = lVar6 + -1;
        } while (bVar17);
        local_38[0] = local_60[0];
        local_38[1] = local_60[1];
        local_38[2] = local_60[2];
        local_38[3] = local_60[3];
        local_38[4] = local_60[4];
        local_38[5] = local_60[5];
        local_38[6] = local_60[6];
        local_38[7] = local_60[7];
        lVar6 = 0;
        uVar15 = 0;
        do {
          uVar15 = uVar15 + (uint)local_38[lVar6] * 10;
          local_38[lVar6] = (value_type_conflict4)uVar15;
          uVar15 = uVar15 >> 8;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 8);
        local_60[0] = avVar4[0];
        local_60[1] = avVar4[1];
        local_60[2] = avVar4[2];
        local_60[3] = avVar4[3];
        local_60[4] = avVar4[4];
        local_60[5] = avVar4[5];
        local_60[6] = avVar4[6];
        local_60[7] = avVar4[7];
        local_68.elems[0] = local_60[0];
        local_68.elems[1] = local_60[1];
        local_68.elems[2] = local_60[2];
        local_68.elems[3] = local_60[3];
        local_68.elems[4] = local_60[4];
        local_68.elems[5] = local_60[5];
        local_68.elems[6] = local_60[6];
        local_68.elems[7] = local_60[7];
        lVar6 = 0;
        bVar17 = false;
        do {
          uVar12 = ((ushort)local_68.elems[lVar6] - (ushort)bVar17) - (ushort)local_38[lVar6];
          bVar17 = 0xff < uVar12;
          local_68.elems[lVar6] = (value_type_conflict4)uVar12;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 8);
        local_60 = avVar5;
        if ((long)local_68.elems < 0) {
          uVar7 = uintwide_t<64U,_unsigned_char,_void,_true>::operator-
                            ((uintwide_t<64U,_unsigned_char,_void,_true> *)&local_68);
          local_68.elems[0] = -uVar7.values.super_array<unsigned_char,_8UL>.elems[0];
        }
        else {
          local_68.elems[0] = SUB81(local_68.elems,0);
        }
        abStack_58[uVar9 - 1 & 0xffffffff] = local_68.elems[0] + 0x30;
        uVar9 = uVar9 - 1;
      } while( true );
    }
    if (iVar13 != 8) {
      return false;
    }
    avVar3 = *(value_type_conflict4 (*) [8])this;
    local_68.elems[0] = avVar3[0];
    local_68.elems[1] = avVar3[1];
    local_68.elems[2] = avVar3[2];
    local_68.elems[3] = avVar3[3];
    local_68.elems[4] = avVar3[4];
    local_68.elems[5] = avVar3[5];
    local_68.elems[6] = avVar3[6];
    local_68.elems[7] = avVar3[7];
    abStack_58[0x10] = 0;
    abStack_58[0x11] = 0;
    abStack_58[0x12] = 0;
    abStack_58[0x13] = 0;
    abStack_58[0x14] = 0;
    abStack_58[0x15] = 0;
    abStack_58[0x16] = 0;
    uStack_41 = 0;
    uStack_3d = 0;
    uStack_3c = 0;
    uStack_3b = 0;
    abStack_58[0] = 0;
    abStack_58[1] = 0;
    abStack_58[2] = 0;
    abStack_58[3] = 0;
    abStack_58[4] = 0;
    abStack_58[5] = 0;
    abStack_58[6] = 0;
    abStack_58[7] = 0;
    abStack_58[8] = 0;
    abStack_58[9] = 0;
    abStack_58[10] = 0;
    abStack_58[0xb] = 0;
    abStack_58[0xc] = 0;
    abStack_58[0xd] = 0;
    abStack_58[0xe] = 0;
    abStack_58[0xf] = 0;
    if (avVar3[0] == '\0') {
      lVar6 = 1;
      do {
        lVar11 = lVar6;
        if (lVar11 == 8) goto LAB_0013df4e;
        lVar6 = lVar11 + 1;
      } while (local_68.elems[lVar11] == '\0');
      if (lVar11 == 8) {
LAB_0013df4e:
        uStack_3c = 0x30;
        uVar9 = 0x1c;
LAB_0013df58:
        if (show_base && 0 < (long)uVar9) {
          uVar9 = uVar9 - 1;
          abStack_58[uVar9 & 0xffffffff] = 0x30;
        }
        if (show_pos && 0 < (long)uVar9) {
          uVar9 = uVar9 - 1;
          abStack_58[uVar9 & 0xffffffff] = 0x2b;
        }
        if (field_width != 0) {
          lVar6 = 0;
          if (field_width < 0x1e) {
            lVar6 = 0x1d - field_width;
          }
          while (lVar6 < (long)uVar9) {
            uVar9 = uVar9 - 1;
            abStack_58[uVar9 & 0xffffffff] = fill_char_str;
          }
        }
        uStack_3b = 0;
        lVar6 = 0;
        do {
          bVar16 = abStack_58[lVar6 + uVar9];
          str_result[lVar6] = bVar16;
          lVar6 = lVar6 + 1;
        } while (bVar16 != 0);
        return true;
      }
    }
    uVar9 = 0x1d;
    do {
      if (local_68.elems[0] == 0) {
        lVar6 = 1;
        do {
          bVar17 = lVar6 == 8;
          if (bVar17) break;
          pvVar1 = local_68.elems + lVar6;
          lVar6 = lVar6 + 1;
        } while (*pvVar1 == '\0');
      }
      else {
        bVar17 = false;
      }
      uVar10 = uVar9 - 1;
      if ((uVar9 == 0) || (bVar17)) goto LAB_0013df58;
      abStack_58[uVar10 & 0xffffffff] = local_68.elems[0] & 7 | 0x30;
      lVar6 = 7;
      bVar16 = 0;
      do {
        bVar2 = local_68.elems[lVar6];
        local_68.elems[lVar6] = bVar2 >> 3 | bVar16;
        bVar16 = bVar2 << 5;
        bVar17 = lVar6 != 0;
        lVar6 = lVar6 + -1;
        uVar9 = uVar10;
      } while (bVar17);
    } while( true );
  }
  avVar3 = *(value_type_conflict4 (*) [8])this;
  local_68.elems[0] = avVar3[0];
  local_68.elems[1] = avVar3[1];
  local_68.elems[2] = avVar3[2];
  local_68.elems[3] = avVar3[3];
  local_68.elems[4] = avVar3[4];
  local_68.elems[5] = avVar3[5];
  local_68.elems[6] = avVar3[6];
  local_68.elems[7] = avVar3[7];
  abStack_58[0] = 0;
  abStack_58[1] = 0;
  abStack_58[2] = 0;
  abStack_58[3] = 0;
  abStack_58[4] = 0;
  abStack_58[5] = 0;
  abStack_58[6] = 0;
  abStack_58[7] = 0;
  abStack_58[8] = 0;
  abStack_58[9] = 0;
  abStack_58[10] = 0;
  abStack_58[0xb] = 0;
  abStack_58[0xc] = 0;
  abStack_58[0xd] = 0;
  abStack_58[0xe] = 0;
  abStack_58[0xf] = 0;
  abStack_58[0x10] = 0;
  abStack_58[0x11] = 0;
  abStack_58[0x12] = 0;
  abStack_58[0x13] = 0;
  abStack_58[0x14] = 0;
  abStack_58[0x15] = 0;
  abStack_58[0x16] = 0;
  uStack_41 = uStack_41 & 0xffffff00;
  if (avVar3[0] == '\0') {
    lVar6 = 1;
    do {
      lVar11 = lVar6;
      if (lVar11 == 8) goto LAB_0013dee7;
      lVar6 = lVar11 + 1;
    } while (local_68.elems[lVar11] == '\0');
    if (lVar11 == 8) {
LAB_0013dee7:
      abStack_58[0x16] = 0x30;
      uVar9 = 0x16;
      goto LAB_0013def1;
    }
  }
  uVar8 = uintwide_t<64U,_unsigned_char,_void,_true>::extract_hex_digits<false,_nullptr>
                    ((uintwide_t<64U,_unsigned_char,_void,_false> *)&local_68,(char *)&uStack_41,
                     is_uppercase);
  uVar9 = 0x17 - uVar8;
LAB_0013def1:
  if ((show_base) && (1 < (long)uVar9)) {
    abStack_58[(int)uVar9 - 1] = !is_uppercase << 5 | 0x58;
    uVar9 = uVar9 - 2;
    abStack_58[uVar9 & 0xffffffff] = 0x30;
  }
  if ((show_pos) && (0 < (long)uVar9)) {
    uVar9 = uVar9 - 1;
    abStack_58[uVar9 & 0xffffffff] = 0x2b;
  }
  if (field_width != 0) {
    lVar6 = 0;
    if (field_width < 0x18) {
      lVar6 = 0x17 - field_width;
    }
    while (lVar6 < (long)uVar9) {
      uVar9 = uVar9 - 1;
      abStack_58[uVar9 & 0xffffffff] = fill_char_str;
    }
  }
  uStack_41 = uStack_41 & 0xffffff00;
  lVar6 = 0;
  do {
    bVar16 = abStack_58[lVar6 + uVar9];
    str_result[lVar6] = bVar16;
    lVar6 = lVar6 + 1;
  } while (bVar16 != 0);
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }